

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_uses_free(ly_ctx *ctx,lys_node_uses *uses,
                  _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_28;
  int local_24;
  int j;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_uses *uses_local;
  ly_ctx *ctx_local;
  
  for (local_24 = 0; local_24 < (int)(uint)uses->refine_size; local_24 = local_24 + 1) {
    lydict_remove(ctx,uses->refine[local_24].target_name);
    lydict_remove(ctx,uses->refine[local_24].dsc);
    lydict_remove(ctx,uses->refine[local_24].ref);
    lys_iffeature_free(ctx,uses->refine[local_24].iffeature,uses->refine[local_24].iffeature_size,0,
                       private_destructor);
    for (local_28 = 0; local_28 < (int)(uint)uses->refine[local_24].must_size;
        local_28 = local_28 + 1) {
      lys_restr_free(ctx,uses->refine[local_24].must + local_28,private_destructor);
    }
    free(uses->refine[local_24].must);
    for (local_28 = 0; local_28 < (int)(uint)uses->refine[local_24].dflt_size;
        local_28 = local_28 + 1) {
      lydict_remove(ctx,uses->refine[local_24].dflt[local_28]);
    }
    free(uses->refine[local_24].dflt);
    lys_extension_instances_free
              (ctx,uses->refine[local_24].ext,(uint)uses->refine[local_24].ext_size,
               private_destructor);
    if ((uses->refine[local_24].target_type & 1) != 0) {
      lydict_remove(ctx,uses->refine[local_24].mod.presence);
    }
  }
  free(uses->refine);
  for (local_24 = 0; local_24 < (int)(uint)uses->augment_size; local_24 = local_24 + 1) {
    lys_augment_free(ctx,uses->augment + local_24,private_destructor);
  }
  free(uses->augment);
  lys_when_free(ctx,uses->when,private_destructor);
  return;
}

Assistant:

static void
lys_uses_free(struct ly_ctx *ctx, struct lys_node_uses *uses,
              void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i, j;

    for (i = 0; i < uses->refine_size; i++) {
        lydict_remove(ctx, uses->refine[i].target_name);
        lydict_remove(ctx, uses->refine[i].dsc);
        lydict_remove(ctx, uses->refine[i].ref);

        lys_iffeature_free(ctx, uses->refine[i].iffeature, uses->refine[i].iffeature_size, 0, private_destructor);

        for (j = 0; j < uses->refine[i].must_size; j++) {
            lys_restr_free(ctx, &uses->refine[i].must[j], private_destructor);
        }
        free(uses->refine[i].must);

        for (j = 0; j < uses->refine[i].dflt_size; j++) {
            lydict_remove(ctx, uses->refine[i].dflt[j]);
        }
        free(uses->refine[i].dflt);

        lys_extension_instances_free(ctx, uses->refine[i].ext, uses->refine[i].ext_size, private_destructor);

        if (uses->refine[i].target_type & LYS_CONTAINER) {
            lydict_remove(ctx, uses->refine[i].mod.presence);
        }
    }
    free(uses->refine);

    for (i = 0; i < uses->augment_size; i++) {
        lys_augment_free(ctx, &uses->augment[i], private_destructor);
    }
    free(uses->augment);

    lys_when_free(ctx, uses->when, private_destructor);
}